

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<char,_10>::Resize(TPZManVector<char,_10> *this,int64_t newsize,char *object)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  char *pcVar31;
  long lVar32;
  long lVar33;
  int64_t i;
  long lVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar60;
  int iVar61;
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar34 = (this->super_TPZVec<char>).fNElements;
  if (lVar34 != newsize) {
    lVar32 = (this->super_TPZVec<char>).fNAlloc;
    if (lVar32 < newsize) {
      if ((ulong)newsize < 0xb) {
        if (lVar34 < 1) {
          lVar34 = 0;
        }
        else {
          pcVar31 = (this->super_TPZVec<char>).fStore;
          lVar32 = 0;
          do {
            this->fExtAlloc[lVar32] = pcVar31[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar34 != lVar32);
        }
        auVar30 = _DAT_014d2b10;
        auVar29 = _DAT_014d2b00;
        auVar28 = _DAT_014d2af0;
        auVar27 = _DAT_014d2ae0;
        auVar26 = _DAT_014d2ad0;
        auVar25 = _DAT_014d28c0;
        auVar24 = _DAT_014d28b0;
        lVar32 = newsize - lVar34;
        if (lVar32 != 0 && lVar34 <= newsize) {
          cVar1 = *object;
          lVar33 = lVar32 + -1;
          auVar36._8_4_ = (int)lVar33;
          auVar36._0_8_ = lVar33;
          auVar36._12_4_ = (int)((ulong)lVar33 >> 0x20);
          uVar35 = 0;
          do {
            auVar55._8_4_ = (int)uVar35;
            auVar55._0_8_ = uVar35;
            auVar55._12_4_ = (int)(uVar35 >> 0x20);
            auVar58 = auVar36 ^ auVar25;
            auVar63 = (auVar55 | auVar24) ^ auVar25;
            iVar57 = auVar58._0_4_;
            iVar76 = -(uint)(iVar57 < auVar63._0_4_);
            iVar60 = auVar58._4_4_;
            auVar65._4_4_ = -(uint)(iVar60 < auVar63._4_4_);
            iVar61 = auVar58._8_4_;
            iVar80 = -(uint)(iVar61 < auVar63._8_4_);
            iVar62 = auVar58._12_4_;
            auVar65._12_4_ = -(uint)(iVar62 < auVar63._12_4_);
            auVar38._4_4_ = iVar76;
            auVar38._0_4_ = iVar76;
            auVar38._8_4_ = iVar80;
            auVar38._12_4_ = iVar80;
            auVar38 = pshuflw(in_XMM1,auVar38,0xe8);
            auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar60);
            auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar62);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar47 = pshuflw(in_XMM2,auVar64,0xe8);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar63 = pshuflw(auVar38,auVar65,0xe8);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar58 = (auVar63 | auVar47 & auVar38) ^ auVar58;
            auVar58 = packssdw(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34] = cVar1;
            }
            auVar47._4_4_ = iVar76;
            auVar47._0_4_ = iVar76;
            auVar47._8_4_ = iVar80;
            auVar47._12_4_ = iVar80;
            auVar65 = auVar64 & auVar47 | auVar65;
            auVar58 = packssdw(auVar65,auVar65);
            auVar63._8_4_ = 0xffffffff;
            auVar63._0_8_ = 0xffffffffffffffff;
            auVar63._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar63,auVar58 ^ auVar63);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 1] = cVar1;
            }
            auVar58 = (auVar55 | auVar30) ^ auVar25;
            auVar48._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar48._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar48._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar48._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar66._4_4_ = auVar48._0_4_;
            auVar66._0_4_ = auVar48._0_4_;
            auVar66._8_4_ = auVar48._8_4_;
            auVar66._12_4_ = auVar48._8_4_;
            iVar76 = -(uint)(auVar58._4_4_ == iVar60);
            iVar80 = -(uint)(auVar58._12_4_ == iVar62);
            auVar12._4_4_ = iVar76;
            auVar12._0_4_ = iVar76;
            auVar12._8_4_ = iVar80;
            auVar12._12_4_ = iVar80;
            auVar77._4_4_ = auVar48._4_4_;
            auVar77._0_4_ = auVar48._4_4_;
            auVar77._8_4_ = auVar48._12_4_;
            auVar77._12_4_ = auVar48._12_4_;
            auVar58 = auVar12 & auVar66 | auVar77;
            auVar58 = packssdw(auVar58,auVar58);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar3,auVar58 ^ auVar3);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 2] = cVar1;
            }
            auVar58 = pshufhw(auVar58,auVar66,0x84);
            auVar13._4_4_ = iVar76;
            auVar13._0_4_ = iVar76;
            auVar13._8_4_ = iVar80;
            auVar13._12_4_ = iVar80;
            auVar63 = pshufhw(auVar48,auVar13,0x84);
            auVar38 = pshufhw(auVar58,auVar77,0x84);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar39 = (auVar38 | auVar63 & auVar58) ^ auVar39;
            auVar58 = packssdw(auVar39,auVar39);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 3] = cVar1;
            }
            auVar58 = (auVar55 | auVar29) ^ auVar25;
            auVar49._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar49._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar49._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar49._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar14._4_4_ = auVar49._0_4_;
            auVar14._0_4_ = auVar49._0_4_;
            auVar14._8_4_ = auVar49._8_4_;
            auVar14._12_4_ = auVar49._8_4_;
            auVar63 = pshuflw(auVar77,auVar14,0xe8);
            auVar40._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
            auVar40._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
            auVar40._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
            auVar40._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
            auVar67._4_4_ = auVar40._4_4_;
            auVar67._0_4_ = auVar40._4_4_;
            auVar67._8_4_ = auVar40._12_4_;
            auVar67._12_4_ = auVar40._12_4_;
            auVar58 = pshuflw(auVar40,auVar67,0xe8);
            auVar68._4_4_ = auVar49._4_4_;
            auVar68._0_4_ = auVar49._4_4_;
            auVar68._8_4_ = auVar49._12_4_;
            auVar68._12_4_ = auVar49._12_4_;
            auVar38 = pshuflw(auVar49,auVar68,0xe8);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 & auVar63,(auVar38 | auVar58 & auVar63) ^ auVar4);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 4] = cVar1;
            }
            auVar15._4_4_ = auVar49._0_4_;
            auVar15._0_4_ = auVar49._0_4_;
            auVar15._8_4_ = auVar49._8_4_;
            auVar15._12_4_ = auVar49._8_4_;
            auVar68 = auVar67 & auVar15 | auVar68;
            auVar38 = packssdw(auVar68,auVar68);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58,auVar38 ^ auVar5);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._4_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 5] = cVar1;
            }
            auVar58 = (auVar55 | auVar28) ^ auVar25;
            auVar50._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar50._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar50._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar50._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar69._4_4_ = auVar50._0_4_;
            auVar69._0_4_ = auVar50._0_4_;
            auVar69._8_4_ = auVar50._8_4_;
            auVar69._12_4_ = auVar50._8_4_;
            iVar76 = -(uint)(auVar58._4_4_ == iVar60);
            iVar80 = -(uint)(auVar58._12_4_ == iVar62);
            auVar16._4_4_ = iVar76;
            auVar16._0_4_ = iVar76;
            auVar16._8_4_ = iVar80;
            auVar16._12_4_ = iVar80;
            auVar78._4_4_ = auVar50._4_4_;
            auVar78._0_4_ = auVar50._4_4_;
            auVar78._8_4_ = auVar50._12_4_;
            auVar78._12_4_ = auVar50._12_4_;
            auVar58 = auVar16 & auVar69 | auVar78;
            auVar58 = packssdw(auVar58,auVar58);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar6,auVar58 ^ auVar6);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 6] = cVar1;
            }
            auVar58 = pshufhw(auVar58,auVar69,0x84);
            auVar17._4_4_ = iVar76;
            auVar17._0_4_ = iVar76;
            auVar17._8_4_ = iVar80;
            auVar17._12_4_ = iVar80;
            auVar63 = pshufhw(auVar50,auVar17,0x84);
            auVar38 = pshufhw(auVar58,auVar78,0x84);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar41 = (auVar38 | auVar63 & auVar58) ^ auVar41;
            auVar58 = packssdw(auVar41,auVar41);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._6_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 7] = cVar1;
            }
            auVar58 = (auVar55 | auVar27) ^ auVar25;
            auVar51._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar51._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar51._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar51._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar18._4_4_ = auVar51._0_4_;
            auVar18._0_4_ = auVar51._0_4_;
            auVar18._8_4_ = auVar51._8_4_;
            auVar18._12_4_ = auVar51._8_4_;
            auVar63 = pshuflw(auVar78,auVar18,0xe8);
            auVar42._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
            auVar42._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
            auVar42._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
            auVar42._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
            auVar70._4_4_ = auVar42._4_4_;
            auVar70._0_4_ = auVar42._4_4_;
            auVar70._8_4_ = auVar42._12_4_;
            auVar70._12_4_ = auVar42._12_4_;
            auVar58 = pshuflw(auVar42,auVar70,0xe8);
            auVar71._4_4_ = auVar51._4_4_;
            auVar71._0_4_ = auVar51._4_4_;
            auVar71._8_4_ = auVar51._12_4_;
            auVar71._12_4_ = auVar51._12_4_;
            auVar38 = pshuflw(auVar51,auVar71,0xe8);
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar52 = (auVar38 | auVar58 & auVar63) ^ auVar52;
            auVar38 = packssdw(auVar52,auVar52);
            auVar58 = packsswb(auVar58 & auVar63,auVar38);
            if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 8] = cVar1;
            }
            auVar19._4_4_ = auVar51._0_4_;
            auVar19._0_4_ = auVar51._0_4_;
            auVar19._8_4_ = auVar51._8_4_;
            auVar19._12_4_ = auVar51._8_4_;
            auVar71 = auVar70 & auVar19 | auVar71;
            auVar38 = packssdw(auVar71,auVar71);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar38 = packssdw(auVar38 ^ auVar7,auVar38 ^ auVar7);
            auVar58 = packsswb(auVar58,auVar38);
            if ((auVar58._8_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 9] = cVar1;
            }
            auVar58 = (auVar55 | auVar26) ^ auVar25;
            auVar53._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar53._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar53._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar53._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar72._4_4_ = auVar53._0_4_;
            auVar72._0_4_ = auVar53._0_4_;
            auVar72._8_4_ = auVar53._8_4_;
            auVar72._12_4_ = auVar53._8_4_;
            iVar76 = -(uint)(auVar58._4_4_ == iVar60);
            iVar80 = -(uint)(auVar58._12_4_ == iVar62);
            auVar20._4_4_ = iVar76;
            auVar20._0_4_ = iVar76;
            auVar20._8_4_ = iVar80;
            auVar20._12_4_ = iVar80;
            auVar79._4_4_ = auVar53._4_4_;
            auVar79._0_4_ = auVar53._4_4_;
            auVar79._8_4_ = auVar53._12_4_;
            auVar79._12_4_ = auVar53._12_4_;
            auVar58 = auVar20 & auVar72 | auVar79;
            auVar58 = packssdw(auVar58,auVar58);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar8,auVar58 ^ auVar8);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 10] = cVar1;
            }
            auVar58 = pshufhw(auVar58,auVar72,0x84);
            auVar21._4_4_ = iVar76;
            auVar21._0_4_ = iVar76;
            auVar21._8_4_ = iVar80;
            auVar21._12_4_ = iVar80;
            auVar63 = pshufhw(auVar53,auVar21,0x84);
            auVar38 = pshufhw(auVar58,auVar79,0x84);
            auVar43._8_4_ = 0xffffffff;
            auVar43._0_8_ = 0xffffffffffffffff;
            auVar43._12_4_ = 0xffffffff;
            auVar43 = (auVar38 | auVar63 & auVar58) ^ auVar43;
            auVar58 = packssdw(auVar43,auVar43);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._10_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 0xb] = cVar1;
            }
            auVar58 = (auVar55 | _DAT_014d2ac0) ^ auVar25;
            auVar54._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar54._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar54._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar54._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar22._4_4_ = auVar54._0_4_;
            auVar22._0_4_ = auVar54._0_4_;
            auVar22._8_4_ = auVar54._8_4_;
            auVar22._12_4_ = auVar54._8_4_;
            auVar63 = pshuflw(auVar79,auVar22,0xe8);
            auVar44._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
            auVar44._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
            auVar44._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
            auVar44._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
            auVar73._4_4_ = auVar44._4_4_;
            auVar73._0_4_ = auVar44._4_4_;
            auVar73._8_4_ = auVar44._12_4_;
            auVar73._12_4_ = auVar44._12_4_;
            auVar58 = pshuflw(auVar44,auVar73,0xe8);
            auVar74._4_4_ = auVar54._4_4_;
            auVar74._0_4_ = auVar54._4_4_;
            auVar74._8_4_ = auVar54._12_4_;
            auVar74._12_4_ = auVar54._12_4_;
            auVar38 = pshuflw(auVar54,auVar74,0xe8);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 & auVar63,(auVar38 | auVar58 & auVar63) ^ auVar9);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 0xc] = cVar1;
            }
            auVar23._4_4_ = auVar54._0_4_;
            auVar23._0_4_ = auVar54._0_4_;
            auVar23._8_4_ = auVar54._8_4_;
            auVar23._12_4_ = auVar54._8_4_;
            auVar74 = auVar73 & auVar23 | auVar74;
            auVar38 = packssdw(auVar74,auVar74);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58,auVar38 ^ auVar10);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._12_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 0xd] = cVar1;
            }
            auVar58 = (auVar55 | _DAT_014d2ab0) ^ auVar25;
            auVar45._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
            auVar45._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
            auVar45._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
            auVar45._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
            auVar75._4_4_ = auVar45._0_4_;
            auVar75._0_4_ = auVar45._0_4_;
            auVar75._8_4_ = auVar45._8_4_;
            auVar75._12_4_ = auVar45._8_4_;
            auVar56._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
            auVar56._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar59._4_4_ = auVar45._4_4_;
            auVar59._0_4_ = auVar45._4_4_;
            auVar59._8_4_ = auVar45._12_4_;
            auVar59._12_4_ = auVar45._12_4_;
            auVar38 = auVar56 & auVar75 | auVar59;
            auVar58 = packssdw(auVar45,auVar38);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar11,auVar58 ^ auVar11);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              this->fExtAlloc[uVar35 + lVar34 + 0xe] = cVar1;
            }
            auVar58 = pshufhw(auVar58,auVar75,0x84);
            auVar38 = pshufhw(auVar38,auVar56,0x84);
            in_XMM2 = auVar38 & auVar58;
            auVar58 = pshufhw(auVar58,auVar59,0x84);
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar46 = (auVar58 | in_XMM2) ^ auVar46;
            auVar58 = packssdw(auVar46,auVar46);
            in_XMM1 = packsswb(auVar58,auVar58);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              this->fExtAlloc[uVar35 + lVar34 + 0xf] = cVar1;
            }
            uVar35 = uVar35 + 0x10;
          } while ((lVar32 + 0xfU & 0xfffffffffffffff0) != uVar35);
        }
        pcVar31 = (this->super_TPZVec<char>).fStore;
        if (pcVar31 != (char *)0x0 && pcVar31 != this->fExtAlloc) {
          operator_delete__(pcVar31);
        }
        (this->super_TPZVec<char>).fStore = this->fExtAlloc;
        (this->super_TPZVec<char>).fNElements = newsize;
        (this->super_TPZVec<char>).fNAlloc = 10;
      }
      else {
        dVar37 = (double)lVar32 * 1.2;
        uVar35 = (long)dVar37;
        if (dVar37 < (double)newsize) {
          uVar35 = newsize;
        }
        pcVar31 = (char *)operator_new__(uVar35);
        if (lVar34 < 1) {
          lVar34 = 0;
        }
        else {
          pcVar2 = (this->super_TPZVec<char>).fStore;
          lVar32 = 0;
          do {
            pcVar31[lVar32] = pcVar2[lVar32];
            lVar32 = lVar32 + 1;
          } while (lVar34 != lVar32);
        }
        if (newsize - lVar34 != 0 && lVar34 <= newsize) {
          memset(pcVar31 + lVar34,(uint)(byte)*object,newsize - lVar34);
        }
        pcVar2 = (this->super_TPZVec<char>).fStore;
        if (pcVar2 != (char *)0x0 && pcVar2 != this->fExtAlloc) {
          operator_delete__(pcVar2);
        }
        (this->super_TPZVec<char>).fStore = pcVar31;
        (this->super_TPZVec<char>).fNElements = newsize;
        (this->super_TPZVec<char>).fNAlloc = uVar35;
      }
    }
    else {
      if (lVar34 < newsize) {
        cVar1 = *object;
        do {
          (this->super_TPZVec<char>).fStore[lVar34] = cVar1;
          lVar34 = lVar34 + 1;
        } while (newsize != lVar34);
      }
      (this->super_TPZVec<char>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}